

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<FMugShotFrame,_FMugShotFrame>::DoCopy
          (TArray<FMugShotFrame,_FMugShotFrame> *this,TArray<FMugShotFrame,_FMugShotFrame> *other)

{
  uint uVar1;
  FMugShotFrame *pFVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (FMugShotFrame *)0x0;
  }
  else {
    pFVar2 = (FMugShotFrame *)
             M_Malloc_Dbg((ulong)uVar1 * 0x18,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                          ,0x199);
    this->Array = pFVar2;
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < this->Count; uVar3 = uVar3 + 1) {
      FMugShotFrame::FMugShotFrame
                ((FMugShotFrame *)((long)&(this->Array->Graphic).Array + lVar4),
                 (FMugShotFrame *)((long)&(other->Array->Graphic).Array + lVar4));
      lVar4 = lVar4 + 0x18;
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}